

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Compression anon_unknown.dwarf_deba::getCompression(string *str)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this;
  Compression CVar3;
  Compression CVar4;
  stringstream e;
  char *local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  CVar3 = NO_COMPRESSION;
  CVar4 = NO_COMPRESSION;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)str);
    CVar4 = CVar3;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)str);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)str);
          CVar4 = RLE_COMPRESSION;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)str);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)str);
              CVar4 = ZIP_COMPRESSION;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)str);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)str);
                  CVar4 = PIZ_COMPRESSION;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)str);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)str);
                      CVar4 = PXR24_COMPRESSION;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)str);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)str);
                          CVar4 = B44_COMPRESSION;
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)str);
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)str);
                              CVar4 = B44A_COMPRESSION;
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::string::compare((char *)str);
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::string::compare((char *)str);
                                  CVar4 = DWAA_COMPRESSION;
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::string::compare((char *)str);
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::string::compare((char *)str);
                                      CVar4 = DWAB_COMPRESSION;
                                      if (iVar1 != 0) {
                                        iVar1 = std::__cxx11::string::compare((char *)str);
                                        if (iVar1 != 0) {
                                          std::__cxx11::stringstream::stringstream(local_1a0);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (local_190,"Unknown compression method \"",0x1c)
                                          ;
                                          poVar2 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (local_190,(str->_M_dataplus)._M_p,
                                                             str->_M_string_length);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar2,"\"",1);
                                          this = (invalid_argument *)__cxa_allocate_exception(0x10);
                                          std::__cxx11::stringbuf::str();
                                          std::invalid_argument::invalid_argument(this,local_1c0);
                                          __cxa_throw(this,&std::invalid_argument::typeinfo,
                                                      std::invalid_argument::~invalid_argument);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

Compression
getCompression (const string& str)
{
    Compression c;

    if (str == "no" || str == "none" || str == "NO" || str == "NONE")
    {
        c = NO_COMPRESSION;
    }
    else if (str == "rle" || str == "RLE")
    {
        c = RLE_COMPRESSION;
    }
    else if (str == "zip" || str == "ZIP")
    {
        c = ZIP_COMPRESSION;
    }
    else if (str == "piz" || str == "PIZ")
    {
        c = PIZ_COMPRESSION;
    }
    else if (str == "pxr24" || str == "PXR24")
    {
        c = PXR24_COMPRESSION;
    }
    else if (str == "b44" || str == "B44")
    {
        c = B44_COMPRESSION;
    }
    else if (str == "b44a" || str == "B44A")
    {
        c = B44A_COMPRESSION;
    }
    else if (str == "dwaa" || str == "DWAA")
    {
        c = DWAA_COMPRESSION;
    }
    else if (str == "dwab" || str == "DWAB")
    {
        c = DWAB_COMPRESSION;
    }
    else
    {
        std::stringstream e;
        e << "Unknown compression method \"" << str << "\"";
        throw invalid_argument(e.str().c_str());
    }

    return c;
}